

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.cpp
# Opt level: O0

void kmpc_free(void *ptr)

{
  int gtid;
  long in_RDI;
  kmp_info_t *unaff_retaddr;
  kmp_info_t *th;
  void *in_stack_00000018;
  kmp_info_t *in_stack_00000020;
  int in_stack_00000084;
  char *in_stack_00000088;
  char *in_stack_00000090;
  
  if ((__kmp_init_serial != 0) && (in_RDI != 0)) {
    gtid = __kmp_get_global_thread_id();
    __kmp_thread_from_gtid(gtid);
    __kmp_bget_dequeue(unaff_retaddr);
    if (*(long *)(in_RDI + -8) == 0) {
      __kmp_debug_assert(in_stack_00000090,in_stack_00000088,in_stack_00000084);
    }
    brel(in_stack_00000020,in_stack_00000018);
  }
  return;
}

Assistant:

void kmpc_free(void *ptr) {
  if (!__kmp_init_serial) {
    return;
  }
  if (ptr != NULL) {
    kmp_info_t *th = __kmp_get_thread();
    __kmp_bget_dequeue(th); /* Release any queued buffers */
    // extract allocated pointer and free it
    KMP_ASSERT(*((void **)ptr - 1));
    brel(th, *((void **)ptr - 1));
  }
}